

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O3

Aig_Man_t * Saig_ManDupIsoCanonical(Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  int iVar2;
  char *__s;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  Vec_Int_t *vPermCis;
  Vec_Int_t *__ptr;
  Aig_Man_t *p;
  size_t sVar6;
  char *__dest;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  vPermCis = Saig_ManFindIsoPerm(pAig,fVerbose);
  __ptr = Saig_ManFindIsoPermCos(pAig,vPermCis);
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Aig_ManIncrementTravId(pAig);
  pAVar7 = pAig->pConst1;
  pAVar7->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pAVar7->TravId = pAig->nTravIds;
  if (0 < vPermCis->nSize) {
    lVar9 = 0;
    do {
      iVar1 = vPermCis->pArray[lVar9];
      if (((long)iVar1 < 0) || (pAig->vCis->nSize <= iVar1)) goto LAB_0062bef5;
      pvVar3 = pAig->vCis->pArray[iVar1];
      pAVar7 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar7;
      *(int *)((long)pvVar3 + 0x20) = pAig->nTravIds;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vPermCis->nSize);
  }
  iVar1 = __ptr->nSize;
  lVar9 = (long)iVar1;
  if (lVar9 < 1) {
    Aig_ManSetRegNum(p,pAig->nRegs);
  }
  else {
    piVar4 = __ptr->pArray;
    lVar10 = 0;
    do {
      iVar2 = piVar4[lVar10];
      if (((long)iVar2 < 0) || (pAig->vCos->nSize <= iVar2)) goto LAB_0062bef5;
      Saig_ManDupIsoCanonical_rec
                (p,pAig,(Aig_Obj_t *)
                        (*(ulong *)((long)pAig->vCos->pArray[iVar2] + 8) & 0xfffffffffffffffe));
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
    if (0 < iVar1) {
      piVar4 = __ptr->pArray;
      lVar10 = 0;
      do {
        iVar1 = piVar4[lVar10];
        if (((long)iVar1 < 0) || (pAig->vCos->nSize <= iVar1)) {
LAB_0062bef5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pAig->vCos->pArray[iVar1];
        if (((ulong)pvVar3 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar5 = *(ulong *)((long)pvVar3 + 8);
        uVar8 = uVar5 & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        Aig_ObjCreateCo(p,pAVar7);
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
    Aig_ManSetRegNum(p,pAig->nRegs);
    if (vPermCis == (Vec_Int_t *)0x0) goto LAB_0062becd;
  }
  if (vPermCis->pArray != (int *)0x0) {
    free(vPermCis->pArray);
  }
  free(vPermCis);
LAB_0062becd:
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupIsoCanonical( Aig_Man_t * pAig, int fVerbose )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    Vec_Int_t * vPerm, * vPermCo;
    int i, Entry;
    // derive permutations
    vPerm   = Saig_ManFindIsoPerm( pAig, fVerbose );
    vPermCo = Saig_ManFindIsoPermCos( pAig, vPerm );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pNew->pName = Abc_UtilStrsav( pAig->pName );
    Aig_ManIncrementTravId( pAig );
    // create constant
    pObj = Aig_ManConst1(pAig);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pAig, pObj );
    // create PIs
    Vec_IntForEachEntry( vPerm, Entry, i )
    {
        pObj = Aig_ManCi(pAig, Entry);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjSetTravIdCurrent( pAig, pObj );
    }
    // traverse from the POs
    Vec_IntForEachEntry( vPermCo, Entry, i )
    {
        pObj = Aig_ManCo(pAig, Entry);
        Saig_ManDupIsoCanonical_rec( pNew, pAig, Aig_ObjFanin0(pObj) );
    }
    // create POs
    Vec_IntForEachEntry( vPermCo, Entry, i )
    {
        pObj = Aig_ManCo(pAig, Entry);
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) );
    Vec_IntFreeP( &vPerm );
    Vec_IntFreeP( &vPermCo );
    return pNew;
}